

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprCompare(Parse *pParse,Expr *pA,Expr *pB,int iTab)

{
  u32 *puVar1;
  u8 uVar2;
  short sVar3;
  char *zLeft;
  byte bVar4;
  sqlite3_value *v;
  int iVar5;
  uint uVar6;
  sqlite3_value *pVal;
  u8 aff;
  uint uVar7;
  sqlite3_value *pR;
  sqlite3_value *local_38;
  
  if (pA == (Expr *)0x0 || pB == (Expr *)0x0) {
    return (uint)(pB != pA) * 2;
  }
  if ((pParse != (Parse *)0x0) && (pA->op == 0x94)) {
    local_38 = (Mem *)0x0;
    valueFromExpr(pParse->db,pB,'\x01','A',&local_38,(ValueNewStat4Ctx *)0x0);
    v = local_38;
    if (local_38 != (Mem *)0x0) {
      sVar3 = pA->iColumn;
      bVar4 = (char)sVar3 - 1U & 0x1f;
      uVar6 = 0x80000000;
      if (sVar3 < 0x20) {
        uVar6 = 1 << bVar4;
      }
      puVar1 = &pParse->pVdbe->expmask;
      *puVar1 = *puVar1 | uVar6;
      pVal = sqlite3VdbeGetBoundValue(pParse->pReprepare,(int)sVar3,aff);
      if (pVal == (sqlite3_value *)0x0) {
        sqlite3ValueFree(v);
        sqlite3ValueFree((sqlite3_value *)0x0);
      }
      else {
        if ((pVal->flags & 0xf) == 2) {
          sqlite3ValueText(pVal,'\x01');
        }
        iVar5 = sqlite3MemCompare(pVal,v,(CollSeq *)0x0);
        sqlite3ValueFree(v);
        sqlite3ValueFree(pVal);
        if (iVar5 == 0) {
          return 0 << bVar4;
        }
      }
    }
  }
  uVar6 = pA->flags;
  uVar7 = pB->flags | uVar6;
  if ((uVar7 >> 10 & 1) != 0) {
    if (((uVar6 & pB->flags) >> 10 & 1) == 0) {
      return 2;
    }
    if ((pA->u).iValue == (pB->u).iValue) {
      return 0;
    }
    return 2;
  }
  uVar2 = pA->op;
  if ((uVar2 == 'G') || (uVar2 != pB->op)) {
    if ((uVar2 == 'j') && (uVar6 = sqlite3ExprCompare(pParse,pA->pLeft,pB,iTab), uVar6 < 2)) {
      return 1;
    }
    if ((pB->op == 'j') && (uVar6 = sqlite3ExprCompare(pParse,pA,pB->pLeft,iTab), uVar6 < 2)) {
      return 1;
    }
    return 2;
  }
  if (((uVar2 == 0xa2) || (uVar2 == 0xa4)) || (zLeft = (pA->u).zToken, zLeft == (char *)0x0))
  goto LAB_00183297;
  if (uVar2 == 'j') {
    if ((pB->u).zToken == (char *)0x0) {
      return 2;
    }
    iVar5 = sqlite3StrICmp(zLeft,(pB->u).zToken);
  }
  else {
    if (uVar2 == 'r') {
      return 0;
    }
    if (uVar2 == 0xa1) {
      iVar5 = sqlite3StrICmp(zLeft,(pB->u).zToken);
      if (iVar5 != 0) {
        return 2;
      }
      if ((uVar6 >> 0x18 & 1) == 0) goto LAB_00183297;
      iVar5 = sqlite3WindowCompare(pParse,(pA->y).pWin,(pB->y).pWin);
    }
    else {
      if ((pB->u).zToken == (char *)0x0) goto LAB_00183297;
      iVar5 = strcmp(zLeft,(pB->u).zToken);
    }
  }
  if (iVar5 != 0) {
    return 2;
  }
LAB_00183297:
  if (((pB->flags ^ pA->flags) & 2) != 0) {
    return 2;
  }
  if ((uVar7 >> 0xe & 1) == 0) {
    if ((uVar7 >> 0xb & 1) != 0) {
      return 2;
    }
    if (((uVar7 & 8) == 0) &&
       (iVar5 = sqlite3ExprCompare(pParse,pA->pLeft,pB->pLeft,iTab), iVar5 != 0)) {
      return 2;
    }
    iVar5 = sqlite3ExprCompare(pParse,pA->pRight,pB->pRight,iTab);
    if (iVar5 != 0) {
      return 2;
    }
    iVar5 = sqlite3ExprListCompare((pA->x).pList,(pB->x).pList,iTab);
    if (iVar5 != 0) {
      return 2;
    }
    if (((pA->op != 'n') && (pA->op != 0x9f)) && ((uVar7 >> 0xd & 1) == 0)) {
      if (pA->iColumn != pB->iColumn) {
        return 2;
      }
      if ((pA->iTable != pB->iTable) && (-1 < pB->iTable || pA->iTable != iTab)) {
        return 2;
      }
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCompare(Parse *pParse, Expr *pA, Expr *pB, int iTab){
  u32 combinedFlags;
  if( pA==0 || pB==0 ){
    return pB==pA ? 0 : 2;
  }
  if( pParse && pA->op==TK_VARIABLE && exprCompareVariable(pParse, pA, pB) ){
    return 0;
  }
  combinedFlags = pA->flags | pB->flags;
  if( combinedFlags & EP_IntValue ){
    if( (pA->flags&pB->flags&EP_IntValue)!=0 && pA->u.iValue==pB->u.iValue ){
      return 0;
    }
    return 2;
  }
  if( pA->op!=pB->op || pA->op==TK_RAISE ){
    if( pA->op==TK_COLLATE && sqlite3ExprCompare(pParse, pA->pLeft,pB,iTab)<2 ){
      return 1;
    }
    if( pB->op==TK_COLLATE && sqlite3ExprCompare(pParse, pA,pB->pLeft,iTab)<2 ){
      return 1;
    }
    return 2;
  }
  if( pA->op!=TK_COLUMN && pA->op!=TK_AGG_COLUMN && pA->u.zToken ){
    if( pA->op==TK_FUNCTION ){
      if( sqlite3StrICmp(pA->u.zToken,pB->u.zToken)!=0 ) return 2;
#ifndef SQLITE_OMIT_WINDOWFUNC
      /* Justification for the assert():
      ** window functions have p->op==TK_FUNCTION but aggregate functions
      ** have p->op==TK_AGG_FUNCTION.  So any comparison between an aggregate
      ** function and a window function should have failed before reaching
      ** this point.  And, it is not possible to have a window function and
      ** a scalar function with the same name and number of arguments.  So
      ** if we reach this point, either A and B both window functions or
      ** neither are a window functions. */
      assert( ExprHasProperty(pA,EP_WinFunc)==ExprHasProperty(pB,EP_WinFunc) );
      if( ExprHasProperty(pA,EP_WinFunc) ){
        if( sqlite3WindowCompare(pParse,pA->y.pWin,pB->y.pWin)!=0 ) return 2;
      }
#endif
    }else if( pA->op==TK_NULL ){
      return 0;
    }else if( pA->op==TK_COLLATE ){
      if( sqlite3_stricmp(pA->u.zToken,pB->u.zToken)!=0 ) return 2;
    }else if( ALWAYS(pB->u.zToken!=0) && strcmp(pA->u.zToken,pB->u.zToken)!=0 ){
      return 2;
    }
  }
  if( (pA->flags & EP_Distinct)!=(pB->flags & EP_Distinct) ) return 2;
  if( (combinedFlags & EP_TokenOnly)==0 ){
    if( combinedFlags & EP_xIsSelect ) return 2;
    if( (combinedFlags & EP_FixedCol)==0
     && sqlite3ExprCompare(pParse, pA->pLeft, pB->pLeft, iTab) ) return 2;
    if( sqlite3ExprCompare(pParse, pA->pRight, pB->pRight, iTab) ) return 2;
    if( sqlite3ExprListCompare(pA->x.pList, pB->x.pList, iTab) ) return 2;
    if( pA->op!=TK_STRING
     && pA->op!=TK_TRUEFALSE
     && (combinedFlags & EP_Reduced)==0
    ){
      if( pA->iColumn!=pB->iColumn ) return 2;
      if( pA->iTable!=pB->iTable 
       && (pA->iTable!=iTab || NEVER(pB->iTable>=0)) ) return 2;
    }
  }
  return 0;
}